

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O2

Matrix4f *
Matrix4f::perspectiveProjection
          (Matrix4f *__return_storage_ptr__,float fovYRadians,float aspect,float zNear,float zFar,
          bool directX)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined4 in_XMM2_Db;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  undefined4 in_XMM3_Db;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  undefined8 uVar6;
  
  if (zNear < 0.0) {
    __assert_fail("zNear >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/vecmath/Matrix4f.cpp"
                  ,0x26a,
                  "static Matrix4f Matrix4f::perspectiveProjection(float, float, float, float, bool)"
                 );
  }
  if (0.0 < zFar) {
    Matrix4f(__return_storage_ptr__,0.0);
    fVar1 = tanf(fovYRadians * 0.5);
    __return_storage_ptr__->m_elements[0] = (1.0 / fVar1) / aspect;
    __return_storage_ptr__->m_elements[5] = 1.0 / fVar1;
    __return_storage_ptr__->m_elements[0xb] = -1.0;
    if (directX) {
      auVar8._4_4_ = in_XMM3_Db;
      auVar8._0_4_ = zFar;
      auVar2._0_4_ = zNear - zFar;
      auVar8._8_4_ = in_XMM3_Db;
      auVar8._12_4_ = in_XMM2_Db;
      auVar7._8_8_ = auVar8._8_8_;
      auVar7._4_4_ = zNear * zFar;
      auVar7._0_4_ = zFar;
      auVar2._4_4_ = auVar2._0_4_;
      auVar2._8_4_ = auVar2._0_4_;
      auVar2._12_4_ = auVar2._0_4_;
      auVar9 = divps(auVar7,auVar2);
      uVar6 = auVar9._0_8_;
    }
    else {
      auVar9._4_4_ = in_XMM2_Db;
      auVar9._0_4_ = zNear;
      auVar9._8_4_ = in_XMM2_Dc;
      auVar9._12_4_ = in_XMM2_Dd;
      auVar3._4_12_ = auVar9._4_12_;
      auVar3._0_4_ = zNear + zFar;
      auVar10._0_4_ = zNear - zFar;
      auVar5._0_8_ = auVar3._0_8_;
      auVar5._8_4_ = in_XMM2_Db;
      auVar5._12_4_ = in_XMM3_Db;
      auVar4._8_8_ = auVar5._8_8_;
      auVar4._4_4_ = (zFar + zFar) * zNear;
      auVar4._0_4_ = auVar3._0_4_;
      auVar10._4_4_ = auVar10._0_4_;
      auVar10._8_4_ = auVar10._0_4_;
      auVar10._12_4_ = auVar10._0_4_;
      auVar9 = divps(auVar4,auVar10);
      uVar6 = auVar9._0_8_;
    }
    __return_storage_ptr__->m_elements[10] = (float)uVar6;
    __return_storage_ptr__->m_elements[0xe] = (float)((ulong)uVar6 >> 0x20);
    return __return_storage_ptr__;
  }
  __assert_fail("zFar > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/vecmath/Matrix4f.cpp"
                ,0x26b,
                "static Matrix4f Matrix4f::perspectiveProjection(float, float, float, float, bool)")
  ;
}

Assistant:

Matrix4f Matrix4f::perspectiveProjection( float fovYRadians, float aspect, float zNear, float zFar, bool directX )
{
	assert(zNear >= 0);
	assert(zFar > 0);
	Matrix4f m; // zero matrix

	float yScale = 1.f / tanf( 0.5f * fovYRadians );
	float xScale = yScale / aspect;

	m( 0, 0 ) = xScale;
	m( 1, 1 ) = yScale;
	m( 3, 2 ) = -1;

	if( directX )
	{
		m( 2, 2 ) = zFar / ( zNear - zFar );
		m( 2, 3 ) = zNear * zFar / ( zNear - zFar );
	}
	else
	{
		m( 2, 2 ) = ( zFar + zNear ) / ( zNear - zFar );
		m( 2, 3 ) = 2.f * zFar * zNear / ( zNear - zFar );
	}

	return m;
}